

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O2

Scalar __thiscall
Eigen::
DenseBase<Eigen::Block<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const>const,-1,1,true>>
::redux<Eigen::internal::scalar_sum_op<double,double>>
          (DenseBase<Eigen::Block<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,_1,1,true>>
           *this,scalar_sum_op<double,_double> *func)

{
  Scalar SVar1;
  ThisEvaluator thisEval;
  redux_evaluator<Eigen::Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true>_>
  local_30;
  
  if (0 < *(long *)(this + 0x20)) {
    local_30.
    super_evaluator<Eigen::Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true>_>
    .
    super_block_evaluator<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true,_false>
    .
    super_unary_evaluator<Eigen::Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true>,_Eigen::internal::IndexBased,_double>
    .m_argImpl.
    super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
    .
    super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_double>
    .m_d.argImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.data =
         (double *)**(undefined8 **)this;
    local_30.
    super_evaluator<Eigen::Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true>_>
    .
    super_block_evaluator<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true,_false>
    .
    super_unary_evaluator<Eigen::Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true>,_Eigen::internal::IndexBased,_double>
    .m_argImpl.
    super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
    .
    super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_double>
    .m_d.argImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
    m_outerStride = (*(undefined8 **)this)[1];
    local_30.
    super_evaluator<Eigen::Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true>_>
    .
    super_block_evaluator<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true,_false>
    .
    super_unary_evaluator<Eigen::Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true>,_Eigen::internal::IndexBased,_double>
    .m_startRow.m_value = *(long *)(this + 0x10);
    local_30.
    super_evaluator<Eigen::Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true>_>
    .
    super_block_evaluator<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true,_false>
    .
    super_unary_evaluator<Eigen::Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true>,_Eigen::internal::IndexBased,_double>
    .m_startCol.m_value = *(long *)(this + 0x18);
    local_30.
    super_evaluator<Eigen::Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true>_>
    .
    super_block_evaluator<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true,_false>
    .
    super_unary_evaluator<Eigen::Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true>,_Eigen::internal::IndexBased,_double>
    .m_linear_offset.m_value =
         local_30.
         super_evaluator<Eigen::Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true>_>
         .
         super_block_evaluator<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true,_false>
         .
         super_unary_evaluator<Eigen::Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true>,_Eigen::internal::IndexBased,_double>
         .m_startCol.m_value *
         local_30.
         super_evaluator<Eigen::Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true>_>
         .
         super_block_evaluator<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true,_false>
         .
         super_unary_evaluator<Eigen::Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true>,_Eigen::internal::IndexBased,_double>
         .m_argImpl.
         super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
         .
         super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_double>
         .m_d.argImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
         super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
         m_outerStride +
         local_30.
         super_evaluator<Eigen::Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true>_>
         .
         super_block_evaluator<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true,_false>
         .
         super_unary_evaluator<Eigen::Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true>,_Eigen::internal::IndexBased,_double>
         .m_startRow.m_value;
    SVar1 = internal::
            redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::Block<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const>const,-1,1,true>>,3,0>
            ::
            run<Eigen::Block<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,_1,1,true>>
                      (&local_30,func,
                       (Block<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_true>
                        *)this);
    return SVar1;
  }
  __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Redux.h"
                ,0x19b,
                "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::Block<const Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::Matrix<double, -1, -1>>, -1, 1, true>>::redux(const Func &) const [Derived = Eigen::Block<const Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::Matrix<double, -1, -1>>, -1, 1, true>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE typename internal::traits<Derived>::Scalar
DenseBase<Derived>::redux(const Func& func) const
{
  eigen_assert(this->rows()>0 && this->cols()>0 && "you are using an empty matrix");

  typedef typename internal::redux_evaluator<Derived> ThisEvaluator;
  ThisEvaluator thisEval(derived());

  // The initial expression is passed to the reducer as an additional argument instead of
  // passing it as a member of redux_evaluator to help  
  return internal::redux_impl<Func, ThisEvaluator>::run(thisEval, func, derived());
}